

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

int resolve_instid(lyd_node *data,char *path,int req_inst,lyd_node **ret)

{
  ly_ctx *ctx;
  lyd_node *plVar1;
  lyd_node *plVar2;
  lyd_node *elem;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  lys_module *plVar6;
  LY_ERR *pLVar7;
  char *pcVar8;
  int iVar9;
  char *pcVar10;
  lyd_node *plVar11;
  void *pvVar12;
  char *model;
  char *local_c8;
  int mod_len;
  char *name;
  uint local_64;
  
  ctx = data->schema->module->ctx;
  *ret = (lyd_node *)0x0;
  do {
    plVar11 = data;
    data = plVar11->parent;
  } while (plVar11->parent != (lyd_node *)0x0);
  plVar1 = plVar11->prev;
  elem = plVar11;
  while (plVar2 = plVar11, plVar1 != (lyd_node *)0x0) {
    plVar11 = plVar2->prev;
    plVar1 = plVar11->next;
    elem = plVar2;
  }
  if (*path == '/') {
    pcVar5 = path + 1;
    uVar3 = parse_identifier(pcVar5);
    uVar4 = uVar3;
    if (0 < (int)uVar3) {
      local_c8 = pcVar5;
      local_64 = uVar3;
      if (pcVar5[uVar3] == ':') {
        uVar4 = parse_identifier(pcVar5 + (ulong)uVar3 + 1);
        if (0 < (int)uVar4) {
          uVar4 = uVar3 + uVar4 + 2;
        }
      }
      else {
        uVar4 = ~uVar3;
      }
    }
LAB_0011b068:
    if ((int)uVar4 < 1) {
      ly_vlog(LYE_INCHAR,LY_VLOG_LYD,elem,(ulong)(uint)(int)path[-uVar4],path + -uVar4);
    }
    else {
      pcVar5 = strndup(local_c8,(long)(int)local_64);
      if (pcVar5 != (char *)0x0) {
        plVar6 = ly_ctx_get_module(ctx,pcVar5,(char *)0x0);
        if (ctx->data_clb != (ly_module_data_clb)0x0) {
          if (plVar6 == (lys_module *)0x0) {
            pvVar12 = ctx->data_clb_data;
            pcVar8 = (char *)0x0;
            iVar9 = 0;
            pcVar10 = pcVar5;
          }
          else {
            if ((char)plVar6->field_0x40 < '\0') goto LAB_0011b0f8;
            pcVar8 = plVar6->ns;
            pvVar12 = ctx->data_clb_data;
            iVar9 = 1;
            pcVar10 = plVar6->name;
          }
          (*ctx->data_clb)(ctx,pcVar10,pcVar8,iVar9,pvVar12);
        }
LAB_0011b0f8:
        free(pcVar5);
        goto LAB_0011b76a;
      }
      pLVar7 = ly_errno_location();
      *pLVar7 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","resolve_instid");
    }
    free((void *)0x0);
    iVar9 = -1;
  }
  else {
    uVar4 = 0;
    if (*path != '\0') goto LAB_0011b068;
LAB_0011b76a:
    if (req_inst < 0) {
      iVar9 = 0;
      if ('\x01' < ly_log_level) {
        iVar9 = 0;
        ly_log(LY_LLVRB,"There is no instance of \"%s\", but it is not required.",path);
      }
    }
    else {
      ly_vlog(LYE_NOREQINS,LY_VLOG_NONE,(void *)0x0);
      iVar9 = 1;
    }
  }
  return iVar9;
}

Assistant:

static int
resolve_instid(struct lyd_node *data, const char *path, int req_inst, struct lyd_node **ret)
{
    int i = 0, j;
    const struct lys_module *mod;
    struct ly_ctx *ctx = data->schema->module->ctx;
    const char *model, *name;
    char *str;
    int mod_len, name_len, has_predicate;
    struct unres_data node_match;

    memset(&node_match, 0, sizeof node_match);
    *ret = NULL;

    /* we need root to resolve absolute path */
    for (; data->parent; data = data->parent);
    /* we're still parsing it and the pointer is not correct yet */
    if (data->prev) {
        for (; data->prev->next; data = data->prev);
    }

    /* search for the instance node */
    while (path[i]) {
        j = parse_instance_identifier(&path[i], &model, &mod_len, &name, &name_len, &has_predicate);
        if (j <= 0) {
            LOGVAL(LYE_INCHAR, LY_VLOG_LYD, data, path[i-j], &path[i-j]);
            goto error;
        }
        i += j;

        str = strndup(model, mod_len);
        if (!str) {
            LOGMEM;
            goto error;
        }
        mod = ly_ctx_get_module(ctx, str, NULL);
        if (ctx->data_clb) {
            if (!mod) {
                mod = ctx->data_clb(ctx, str, NULL, 0, ctx->data_clb_data);
            } else if (!mod->implemented) {
                mod = ctx->data_clb(ctx, mod->name, mod->ns, LY_MODCLB_NOT_IMPLEMENTED, ctx->data_clb_data);
            }
        }
        free(str);

        if (!mod || !mod->implemented || mod->disabled) {
            break;
        }

        if (resolve_data(mod, name, name_len, data, &node_match)) {
            /* no instance exists */
            break;
        }

        if (has_predicate) {
            /* we have predicate, so the current results must be list or leaf-list */
            j = resolve_instid_predicate(&path[i], &node_match);
            if (j < 1) {
                LOGVAL(LYE_INPRED, LY_VLOG_LYD, data, &path[i-j]);
                goto error;
            }
            i += j;

            if (!node_match.count) {
                /* no instance exists */
                break;
            }
        }
    }

    if (!node_match.count) {
        /* no instance exists */
        if (req_inst > -1) {
            LOGVAL(LYE_NOREQINS, LY_VLOG_NONE, NULL, path);
            return EXIT_FAILURE;
        }
        LOGVRB("There is no instance of \"%s\", but it is not required.", path);
        return EXIT_SUCCESS;
    } else if (node_match.count > 1) {
        /* instance identifier must resolve to a single node */
        LOGVAL(LYE_TOOMANY, LY_VLOG_LYD, data, path, "data tree");
        goto error;
    } else {
        /* we have required result, remember it and cleanup */
        *ret = node_match.node[0];
        free(node_match.node);
        return EXIT_SUCCESS;
    }

error:
    /* cleanup */
    free(node_match.node);
    return -1;
}